

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.c
# Opt level: O1

CURLcode Curl_req_soft_reset(SingleRequest *req,Curl_easy *data)

{
  bufq *q;
  CURLcode CVar1;
  
  req->bytecount = 0;
  req->writebytecount = 0;
  *(uint *)&req->field_0xd9 = (*(uint *)&req->field_0xd9 & 0xffeff884) + 1;
  req->headerbytecount = 0;
  req->allheadercount = 0;
  req->deductheadercount = 0;
  req->headerline = 0;
  CVar1 = Curl_client_start(data);
  if (CVar1 == CURLE_OK) {
    q = &req->sendbuf;
    if ((req->field_0xdb & 8) == 0) {
      Curl_bufq_init2(q,(ulong)(data->set).upload_buffer_size,1,1);
      req->field_0xdb = req->field_0xdb | 8;
      CVar1 = CURLE_OK;
    }
    else {
      Curl_bufq_reset(q);
      CVar1 = CURLE_OK;
      if ((req->sendbuf).chunk_size != (ulong)(data->set).upload_buffer_size) {
        Curl_bufq_free(q);
        Curl_bufq_init2(q,(ulong)(data->set).upload_buffer_size,1,1);
        CVar1 = CURLE_OK;
      }
    }
  }
  return CVar1;
}

Assistant:

CURLcode Curl_req_soft_reset(struct SingleRequest *req,
                             struct Curl_easy *data)
{
  CURLcode result;

  req->done = FALSE;
  req->upload_done = FALSE;
  req->upload_aborted = FALSE;
  req->download_done = FALSE;
  req->eos_written = FALSE;
  req->eos_read = FALSE;
  req->eos_sent = FALSE;
  req->ignorebody = FALSE;
  req->shutdown = FALSE;
  req->bytecount = 0;
  req->writebytecount = 0;
  req->header = TRUE; /* assume header */
  req->headerline = 0;
  req->headerbytecount = 0;
  req->allheadercount =  0;
  req->deductheadercount = 0;

  result = Curl_client_start(data);
  if(result)
    return result;

  if(!req->sendbuf_init) {
    Curl_bufq_init2(&req->sendbuf, data->set.upload_buffer_size, 1,
                    BUFQ_OPT_SOFT_LIMIT);
    req->sendbuf_init = TRUE;
  }
  else {
    Curl_bufq_reset(&req->sendbuf);
    if(data->set.upload_buffer_size != req->sendbuf.chunk_size) {
      Curl_bufq_free(&req->sendbuf);
      Curl_bufq_init2(&req->sendbuf, data->set.upload_buffer_size, 1,
                      BUFQ_OPT_SOFT_LIMIT);
    }
  }

  return CURLE_OK;
}